

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model-loader.cpp
# Opt level: O1

bool __thiscall
llama_model_loader::get_arr<int,4ul>
          (llama_model_loader *this,string *key,array<int,_4UL> *result,bool required)

{
  ulong uVar1;
  uint k;
  int iVar2;
  runtime_error *prVar3;
  ArrayInfo arr_info;
  string local_60;
  ArrayInfo local_40;
  
  k = gguf_find_key((this->meta)._M_t.super___uniq_ptr_impl<gguf_context,_gguf_context_deleter>._M_t
                    .super__Tuple_impl<0UL,_gguf_context_*,_gguf_context_deleter>.
                    super__Head_base<0UL,_gguf_context_*,_false>._M_head_impl,
                    (key->_M_dataplus)._M_p);
  if (((int)k < 0) ||
     (iVar2 = gguf_get_kv_type((this->meta)._M_t.
                               super___uniq_ptr_impl<gguf_context,_gguf_context_deleter>._M_t.
                               super__Tuple_impl<0UL,_gguf_context_*,_gguf_context_deleter>.
                               super__Head_base<0UL,_gguf_context_*,_false>._M_head_impl,
                               k & 0x7fffffff), iVar2 != 9)) {
    if (!required) {
      return false;
    }
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    format_abi_cxx11_(&local_60,"array key not found in model: %s",(key->_M_dataplus)._M_p);
    std::runtime_error::runtime_error(prVar3,(string *)&local_60);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  GGUFMeta::GKV<GGUFMeta::ArrayInfo>::get_kv
            (&local_40,
             (this->meta)._M_t.super___uniq_ptr_impl<gguf_context,_gguf_context_deleter>._M_t.
             super__Tuple_impl<0UL,_gguf_context_*,_gguf_context_deleter>.
             super__Head_base<0UL,_gguf_context_*,_false>._M_head_impl,k);
  if (local_40.gt != GGUF_TYPE_INT32) {
    if (local_40.gt != GGUF_TYPE_FLOAT32) {
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      format_abi_cxx11_(&local_60,"%s is not a float32, int32 array",(key->_M_dataplus)._M_p);
      std::runtime_error::runtime_error(prVar3,(string *)&local_60);
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-model-loader.cpp"
               ,0x14d,"GGML_ASSERT(%s) failed","(std::is_same<T, float>::value)");
  }
  uVar1 = CONCAT44(local_40.length._4_4_,(uint)local_40.length);
  if (uVar1 < 5) {
    if (uVar1 != 0) {
      memmove(result,local_40.data,uVar1 << 2);
    }
    return true;
  }
  prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
  format_abi_cxx11_(&local_60,"array length %u for key %s exceeds max %u",
                    (ulong)(uint)local_40.length,(key->_M_dataplus)._M_p,4);
  std::runtime_error::runtime_error(prVar3,(string *)&local_60);
  __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

bool llama_model_loader::get_arr(const std::string & key, std::array<T, N_MAX> & result, bool required) {
        const int kid = gguf_find_key(meta.get(), key.c_str());

        if (kid < 0 || gguf_get_kv_type(meta.get(), kid) != GGUF_TYPE_ARRAY) {
            if (required) {
                throw std::runtime_error(format("array key not found in model: %s", key.c_str()));
            }
            return false;
        }

        struct GGUFMeta::ArrayInfo arr_info =
            GGUFMeta::GKV<GGUFMeta::ArrayInfo>::get_kv(meta.get(), kid);

        switch (arr_info.gt) {
            case GGUF_TYPE_FLOAT32: GGML_ASSERT((std::is_same<T, float>::value)); break;
            case GGUF_TYPE_INT32:   GGML_ASSERT(
                                            (std::is_same<T,  int32_t>::value) ||
                                            (std::is_same<T, uint32_t>::value));  break;
            default:
                throw std::runtime_error(format("%s is not a float32, int32 array", key.c_str()));
        }

        if (arr_info.length > N_MAX) {
            throw std::runtime_error(format("array length %u for key %s exceeds max %u", (uint32_t) arr_info.length, key.c_str(), (uint32_t) N_MAX));
        }

        std::copy((const T*)arr_info.data, (const T *)arr_info.data + arr_info.length, result.begin());

        return true;
    }